

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifTune.c
# Opt level: O2

word * Ifn_NtkDeriveTruth(Ifn_Ntk_t *p,int *pValues)

{
  word *pOut;
  word *pOut_00;
  byte bVar1;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  undefined1 *puVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  int *piVar9;
  ulong uVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  int *piVar14;
  uint uVar15;
  long lVar16;
  long local_60;
  
  iVar11 = p->nInps;
  lVar16 = (long)iVar11;
  iVar6 = 0;
  bVar1 = (char)iVar11 - 6;
  if (lVar16 < 7) {
    bVar1 = 0;
  }
  iVar8 = 0;
  if (0 < iVar11) {
    iVar8 = iVar11;
  }
  piVar9 = p->Values;
  for (; iVar6 != iVar8; iVar6 = iVar6 + 1) {
    uVar3 = p->nParsVNum;
    uVar4 = 0;
    uVar10 = 0;
    if (0 < (int)uVar3) {
      uVar10 = (ulong)uVar3;
    }
    iVar11 = 0;
    for (; uVar10 != uVar4; uVar4 = uVar4 + 1) {
      iVar13 = 1 << ((byte)uVar4 & 0x1f);
      if (piVar9[(long)(int)(uVar3 * iVar6 + p->nParsVIni) + uVar4] == 0) {
        iVar13 = 0;
      }
      iVar11 = iVar11 + iVar13;
    }
    uVar3 = p->nWords;
    uVar4 = 0;
    if (0 < (int)uVar3) {
      uVar4 = (ulong)uVar3;
    }
    for (uVar10 = 0; uVar4 != uVar10; uVar10 = uVar10 + 1) {
      p->pTtObjs[(long)(int)(uVar3 * iVar6) + uVar10] =
           p->pTtElems[(long)(iVar11 << (bVar1 & 0x1f)) + uVar10];
    }
  }
  piVar14 = p->Nodes[lVar16].Fanins;
  local_60 = lVar16 * 8;
  while( true ) {
    lVar2 = (long)p->nObjs;
    if (lVar2 <= lVar16) {
      return p->pTtObjs + (long)p->nWords * (lVar2 + -1);
    }
    uVar3 = *(uint *)(p->Nodes + lVar16) & 7;
    if (3 < uVar3 - 3) break;
    uVar12 = *(uint *)(p->Nodes + lVar16) >> 3 & 0x1f;
    uVar4 = (ulong)uVar12;
    uVar15 = p->nWords;
    lVar7 = (long)(int)uVar15;
    pOut = p->pTtObjs + lVar16 * lVar7;
    switch(uVar3) {
    case 3:
      Abc_TtFill(pOut,uVar15);
      for (uVar10 = 0; uVar4 != uVar10; uVar10 = uVar10 + 1) {
        Abc_TtAnd(pOut,pOut,p->pTtObjs + (long)piVar14[uVar10] * (long)p->nWords,p->nWords,
                  (int)piVar9);
      }
      break;
    case 4:
      Abc_TtClear(pOut,uVar15);
      for (uVar10 = 0; uVar4 != uVar10; uVar10 = uVar10 + 1) {
        piVar9 = (int *)0x0;
        Abc_TtXor(pOut,pOut,p->pTtObjs + (long)piVar14[uVar10] * (long)p->nWords,p->nWords,0);
      }
      break;
    case 5:
      if (uVar12 != 3) {
        __assert_fail("nFans == 3",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifTune.c"
                      ,0x3ac,"word *Ifn_NtkDeriveTruth(Ifn_Ntk_t *, int *)");
      }
      iVar11 = p->Nodes[lVar16].Fanins[0];
      iVar6 = p->Nodes[lVar16].Fanins[1];
      iVar8 = p->Nodes[lVar16].Fanins[2];
      puVar5 = (undefined1 *)0x0;
      if (0 < (int)uVar15) {
        puVar5 = (undefined1 *)(ulong)uVar15;
      }
      for (piVar9 = (int *)0x0; (int *)puVar5 != piVar9; piVar9 = (int *)((long)piVar9 + 1)) {
        *(word *)((long)p->pTtObjs + (long)piVar9 * 8 + lVar7 * local_60) =
             (p->pTtObjs[(long)(int)(iVar6 * uVar15) + (long)piVar9] ^
             p->pTtObjs[(long)(int)(iVar8 * uVar15) + (long)piVar9]) &
             p->pTtObjs[(long)(int)(iVar11 * uVar15) + (long)piVar9] ^
             p->pTtObjs[(long)(int)(iVar8 * uVar15) + (long)piVar9];
      }
      break;
    case 6:
      uVar3 = 1 << (sbyte)uVar12;
      pOut_00 = p->pTtObjs + lVar2 * lVar7;
      Abc_TtClear(pOut,uVar15);
      uVar15 = 0;
      if ((int)uVar3 < 1) {
        uVar3 = 0;
      }
      for (; uVar15 != uVar3; uVar15 = uVar15 + 1) {
        if (pValues[(byte)p->Nodes[lVar16].field_0x1 + uVar15] != 0) {
          Abc_TtFill(pOut_00,p->nWords);
          for (uVar10 = 0; uVar4 != uVar10; uVar10 = uVar10 + 1) {
            iVar11 = p->nWords;
            if ((uVar15 >> ((uint)uVar10 & 0x1f) & 1) == 0) {
              Abc_TtSharp(pOut_00,pOut_00,p->pTtObjs + (long)piVar14[uVar10] * (long)iVar11,iVar11);
            }
            else {
              Abc_TtAnd(pOut_00,pOut_00,p->pTtObjs + (long)piVar14[uVar10] * (long)iVar11,iVar11,
                        (int)piVar9);
            }
          }
          Abc_TtOr(pOut,pOut,pOut_00,p->nWords);
        }
      }
    }
    lVar16 = lVar16 + 1;
    piVar14 = piVar14 + 0xc;
    local_60 = local_60 + 8;
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifTune.c"
                ,0x3c1,"word *Ifn_NtkDeriveTruth(Ifn_Ntk_t *, int *)");
}

Assistant:

word * Ifn_NtkDeriveTruth( Ifn_Ntk_t * p, int * pValues )
{
    int i, v, f, iVar, iStart;
    // elementary variables
    for ( i = 0; i < p->nInps; i++ )
    {
        // find variable
        iStart = p->nParsVIni + i * p->nParsVNum;
        for ( v = iVar = 0; v < p->nParsVNum; v++ )
            if ( p->Values[iStart+v] )
                iVar += (1 << v);
        // assign variable
        Abc_TtCopy( Ifn_ObjTruth(p, i), Ifn_ElemTruth(p, iVar), p->nWords, 0 );
    }
    // internal variables
    for ( i = p->nInps; i < p->nObjs; i++ )
    {
        int nFans = p->Nodes[i].nFanins;
        int * pFans = p->Nodes[i].Fanins;
        word * pTruth = Ifn_ObjTruth( p, i );
        if ( p->Nodes[i].Type == IFN_DSD_AND )
        {
            Abc_TtFill( pTruth, p->nWords );
            for ( f = 0; f < nFans; f++ )
                Abc_TtAnd( pTruth, pTruth, Ifn_ObjTruth(p, pFans[f]), p->nWords, 0 );
        }
        else if ( p->Nodes[i].Type == IFN_DSD_XOR )
        {
            Abc_TtClear( pTruth, p->nWords );
            for ( f = 0; f < nFans; f++ )
                Abc_TtXor( pTruth, pTruth, Ifn_ObjTruth(p, pFans[f]), p->nWords, 0 );
        }
        else if ( p->Nodes[i].Type == IFN_DSD_MUX )
        {
            assert( nFans == 3 );
            Abc_TtMux( pTruth, Ifn_ObjTruth(p, pFans[0]), Ifn_ObjTruth(p, pFans[1]), Ifn_ObjTruth(p, pFans[2]), p->nWords );
        }
        else if ( p->Nodes[i].Type == IFN_DSD_PRIME )
        {
            int nValues = (1 << nFans);
            word * pTemp = Ifn_ObjTruth(p, p->nObjs);
            Abc_TtClear( pTruth, p->nWords );
            for ( v = 0; v < nValues; v++ )
            {
                if ( pValues[p->Nodes[i].iFirst + v] == 0 )
                    continue;
                Abc_TtFill( pTemp, p->nWords );
                for ( f = 0; f < nFans; f++ )
                    if ( (v >> f) & 1 )
                        Abc_TtAnd( pTemp, pTemp, Ifn_ObjTruth(p, pFans[f]), p->nWords, 0 );
                    else
                        Abc_TtSharp( pTemp, pTemp, Ifn_ObjTruth(p, pFans[f]), p->nWords );
                Abc_TtOr( pTruth, pTruth, pTemp, p->nWords );
            }
        }
        else assert( 0 );
//Dau_DsdPrintFromTruth( pTruth, p->nVars );
    }
    return Ifn_ObjTruth(p, p->nObjs-1);
}